

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

bool __thiscall Rml::Context::Update(Context *this)

{
  undefined1 *puVar1;
  NodePtr pDVar2;
  bool bVar3;
  int iVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>_>
  *data_model;
  Element *this_00;
  ElementDocument *this_01;
  int i;
  int index;
  double dVar5;
  Vector2f vp_dimensions;
  iterator __begin1;
  
  this->next_update_timeout = INFINITY;
  bVar3 = ScrollController::Update
                    ((this->scroll_controller)._M_t.
                     super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
                     .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl,
                     this->mouse_position,this->density_independent_pixel_ratio);
  if (bVar3) {
    dVar5 = this->next_update_timeout;
    if (0.0 <= dVar5) {
      dVar5 = 0.0;
    }
    this->next_update_timeout = dVar5;
  }
  if (this->mouse_active == true) {
    UpdateHoverChain(this,this->mouse_position,0,(Dictionary *)0x0,(Dictionary *)0x0);
  }
  __begin1 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->data_models);
  pDVar2 = (NodePtr)(this->data_models).mInfo;
  while (__begin1.mKeyVals != pDVar2) {
    DataModel::Update(((__begin1.mKeyVals)->mData).second._M_t.
                      super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>
                      .super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl,true);
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<false>::operator++(&__begin1);
  }
  puVar1 = &((this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->field_0x17;
  *puVar1 = *puVar1 & 0xfd;
  puVar1 = &((this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->field_0x17;
  *puVar1 = *puVar1 & 0xfb;
  vp_dimensions.x = (float)(this->dimensions).x;
  vp_dimensions.y = (float)(this->dimensions).y;
  Element::Update((this->root)._M_t.
                  super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                  this->density_independent_pixel_ratio,vp_dimensions);
  index = 0;
  while( true ) {
    iVar4 = Element::GetNumChildren
                      ((this->root)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
    if (iVar4 <= index) break;
    this_00 = Element::GetChild((this->root)._M_t.
                                super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,index);
    this_01 = Element::GetOwnerDocument(this_00);
    if (this_01 != (ElementDocument *)0x0) {
      ElementDocument::UpdateLayout(this_01);
      ElementDocument::UpdatePosition(this_01);
    }
    index = index + 1;
  }
  ReleaseUnloadedDocuments(this);
  return true;
}

Assistant:

bool Context::Update()
{
	RMLUI_ZoneScoped;

	next_update_timeout = std::numeric_limits<double>::infinity();

	if (scroll_controller->Update(mouse_position, density_independent_pixel_ratio))
		RequestNextUpdate(0);

	// Update the hover chain to detect any new or moved elements under the mouse.
	if (mouse_active)
		UpdateHoverChain(mouse_position);

	// Update all the data models before updating properties and layout.
	for (auto& data_model : data_models)
		data_model.second->Update(true);

	// The style definition of each document should be independent of each other. By manually resetting these flags we avoid unnecessary definition
	// lookups in unrelated documents, such as when adding a new document. Adding an element dirties the parent definition, which in this case is the
	// root. By extension the definition of all the other documents are also dirtied, unnecessarily.
	root->dirty_definition = false;
	root->dirty_child_definitions = false;

	root->Update(density_independent_pixel_ratio, Vector2f(dimensions));

	for (int i = 0; i < root->GetNumChildren(); ++i)
	{
		if (auto doc = root->GetChild(i)->GetOwnerDocument())
		{
			doc->UpdateLayout();
			doc->UpdatePosition();
		}
	}

	// Release any documents that were unloaded during the update.
	ReleaseUnloadedDocuments();

	return true;
}